

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O2

_Bool op_smlald(DisasContext_conflict1 *s,arg_rrrr *a,_Bool m_swap,_Bool sub)

{
  int iVar1;
  int reg;
  ulong uVar2;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  TCGv_i64 ret;
  TCGv_i64 pTVar6;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_3;
  
  uVar2 = s->features;
  if ((uVar2 & 8) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    pTVar4 = load_reg(s,a->rn);
    pTVar5 = load_reg(s,a->rm);
    if (m_swap) {
      gen_swap_half(tcg_ctx,pTVar5);
    }
    gen_smul_dual(tcg_ctx,pTVar4,pTVar5);
    ret = tcg_temp_new_i64(tcg_ctx);
    pTVar6 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext_i32_i64_aarch64(tcg_ctx,ret,pTVar4);
    tcg_gen_ext_i32_i64_aarch64(tcg_ctx,pTVar6,pTVar5);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    if (sub) {
      tcg_gen_sub_i64(tcg_ctx,ret,ret,pTVar6);
    }
    else {
      tcg_gen_add_i64(tcg_ctx,ret,ret,pTVar6);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
    iVar1 = a->rd;
    pTVar3 = s->uc->tcg_ctx;
    pTVar4 = load_reg(s,a->ra);
    pTVar5 = load_reg(s,iVar1);
    pTVar6 = tcg_temp_new_i64(pTVar3);
    tcg_gen_concat_i32_i64_aarch64(pTVar3,pTVar6,pTVar4,pTVar5);
    tcg_temp_free_internal_aarch64(pTVar3,(TCGTemp *)(pTVar4 + (long)pTVar3));
    tcg_temp_free_internal_aarch64(pTVar3,(TCGTemp *)(pTVar5 + (long)pTVar3));
    tcg_gen_add_i64(pTVar3,ret,ret,pTVar6);
    tcg_temp_free_internal_aarch64(pTVar3,(TCGTemp *)(pTVar6 + (long)pTVar3));
    iVar1 = a->ra;
    reg = a->rd;
    pTVar3 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_i32(pTVar3);
    tcg_gen_extrl_i64_i32_aarch64(pTVar3,pTVar4,ret);
    store_reg(s,iVar1,pTVar4);
    pTVar4 = tcg_temp_new_i32(pTVar3);
    tcg_gen_extrh_i64_i32_aarch64(pTVar3,pTVar4,ret);
    store_reg(s,reg,pTVar4);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  }
  return SUB41(((uint)uVar2 & 8) >> 3,0);
}

Assistant:

static inline int arm_dc_feature(DisasContext *dc, int feature)
{
    return (dc->features & (1ULL << feature)) != 0;
}